

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItem(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  MultiNode<QString,_QDomNodePrivate_*> *pMVar2;
  QDomNodePrivate *pQVar3;
  long in_FS_OFFSET;
  iterator iStack_58;
  QString local_40;
  QDomNodePrivate *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QDomNodePrivate *)0x0;
  local_28 = arg;
  if ((arg != (QDomNodePrivate *)0x0) && (this->readonly == false)) {
    if (this->appendToParent == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[7])();
        return (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_00110564;
    }
    local_40.d.d = (arg->name).d.d;
    local_40.d.ptr = (arg->name).d.ptr;
    local_40.d.size = (arg->name).d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this_00 = (this->map).d;
    if (this_00 == (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
LAB_001104b7:
      pQVar3 = (QDomNodePrivate *)0x0;
    }
    else {
      pMVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::
               findNode<QString>(this_00,&local_40);
      if ((pMVar2 == (MultiNode<QString,_QDomNodePrivate_*> *)0x0) ||
         (pMVar2->value == (Chain *)0x0)) goto LAB_001104b7;
      pQVar3 = pMVar2->value->value;
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    LOCK();
    (local_28->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (local_28->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40.d.d = (local_28->name).d.d;
    local_40.d.ptr = (local_28->name).d.ptr;
    local_40.d.size = (local_28->name).d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
              (&iStack_58,&this->map,&local_40,&local_28);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
LAB_00110564:
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItem(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    QDomNodePrivate *n = map.value(arg->nodeName());
    // We take a reference
    arg->ref.ref();
    map.insert(arg->nodeName(), arg);
    return n;
}